

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  char *pcVar1;
  ostream *poVar2;
  ConsoleReporter *this_local;
  
  poVar2 = (ostream *)(this->super_StreamingReporterBase).stream;
  pcVar1 = getLineOfChars<(char)45>();
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }